

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRelaxNGCheckGroupAttrs(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict def)

{
  int iVar1;
  void *pvVar2;
  xmlRelaxNGDefinePtr_conflict *ppxVar3;
  int local_34;
  int ret;
  int j;
  int i;
  int nbchild;
  xmlRelaxNGDefinePtr_conflict cur;
  xmlRelaxNGDefinePtr_conflict **list;
  xmlRelaxNGDefinePtr_conflict def_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  j = 0;
  if (((def != (xmlRelaxNGDefinePtr_conflict)0x0) &&
      (((def->type == XML_RELAXNG_GROUP || (def->type == XML_RELAXNG_ELEMENT)) &&
       ((def->dflags & 0x20U) == 0)))) && (ctxt->nbErrors == 0)) {
    for (_i = def->attrs; _i != (xmlRelaxNGDefinePtr)0x0; _i = _i->next) {
      j = j + 1;
    }
    for (_i = def->content; _i != (xmlRelaxNGDefinePtr)0x0; _i = _i->next) {
      j = j + 1;
    }
    pvVar2 = (*xmlMalloc)((long)j << 3);
    if (pvVar2 == (void *)0x0) {
      xmlRngPErrMemory(ctxt,"building group\n");
    }
    else {
      ret = 0;
      for (_i = def->attrs; _i != (xmlRelaxNGDefinePtr_conflict)0x0; _i = _i->next) {
        ppxVar3 = xmlRelaxNGGetElements(ctxt,_i,1);
        *(xmlRelaxNGDefinePtr_conflict **)((long)pvVar2 + (long)ret * 8) = ppxVar3;
        ret = ret + 1;
      }
      for (_i = def->content; _i != (xmlRelaxNGDefinePtr_conflict)0x0; _i = _i->next) {
        ppxVar3 = xmlRelaxNGGetElements(ctxt,_i,1);
        *(xmlRelaxNGDefinePtr_conflict **)((long)pvVar2 + (long)ret * 8) = ppxVar3;
        ret = ret + 1;
      }
      for (ret = 0; ret < j; ret = ret + 1) {
        if (*(long *)((long)pvVar2 + (long)ret * 8) != 0) {
          for (local_34 = 0; local_34 < ret; local_34 = local_34 + 1) {
            if ((*(long *)((long)pvVar2 + (long)local_34 * 8) != 0) &&
               (iVar1 = xmlRelaxNGCompareElemDefLists
                                  (ctxt,*(xmlRelaxNGDefinePtr_conflict **)
                                         ((long)pvVar2 + (long)ret * 8),
                                   *(xmlRelaxNGDefinePtr_conflict **)
                                    ((long)pvVar2 + (long)local_34 * 8)), iVar1 == 0)) {
              xmlRngPErr(ctxt,def->node,0x410,"Attributes conflicts in group\n",(xmlChar *)0x0,
                         (xmlChar *)0x0);
            }
          }
        }
      }
      for (ret = 0; ret < j; ret = ret + 1) {
        if (*(long *)((long)pvVar2 + (long)ret * 8) != 0) {
          (*xmlFree)(*(void **)((long)pvVar2 + (long)ret * 8));
        }
      }
      (*xmlFree)(pvVar2);
      def->dflags = def->dflags | 0x20;
    }
  }
  return;
}

Assistant:

static void
xmlRelaxNGCheckGroupAttrs(xmlRelaxNGParserCtxtPtr ctxt,
                          xmlRelaxNGDefinePtr def)
{
    xmlRelaxNGDefinePtr **list;
    xmlRelaxNGDefinePtr cur;
    int nbchild = 0, i, j, ret;

    if ((def == NULL) ||
        ((def->type != XML_RELAXNG_GROUP) &&
         (def->type != XML_RELAXNG_ELEMENT)))
        return;

    if (def->dflags & IS_PROCESSED)
        return;

    /*
     * Don't run that check in case of error. Infinite recursion
     * becomes possible.
     */
    if (ctxt->nbErrors != 0)
        return;

    cur = def->attrs;
    while (cur != NULL) {
        nbchild++;
        cur = cur->next;
    }
    cur = def->content;
    while (cur != NULL) {
        nbchild++;
        cur = cur->next;
    }

    list = (xmlRelaxNGDefinePtr **) xmlMalloc(nbchild *
                                              sizeof(xmlRelaxNGDefinePtr
                                                     *));
    if (list == NULL) {
        xmlRngPErrMemory(ctxt, "building group\n");
        return;
    }
    i = 0;
    cur = def->attrs;
    while (cur != NULL) {
        list[i] = xmlRelaxNGGetElements(ctxt, cur, 1);
        i++;
        cur = cur->next;
    }
    cur = def->content;
    while (cur != NULL) {
        list[i] = xmlRelaxNGGetElements(ctxt, cur, 1);
        i++;
        cur = cur->next;
    }

    for (i = 0; i < nbchild; i++) {
        if (list[i] == NULL)
            continue;
        for (j = 0; j < i; j++) {
            if (list[j] == NULL)
                continue;
            ret = xmlRelaxNGCompareElemDefLists(ctxt, list[i], list[j]);
            if (ret == 0) {
                xmlRngPErr(ctxt, def->node, XML_RNGP_GROUP_ATTR_CONFLICT,
                           "Attributes conflicts in group\n", NULL, NULL);
            }
        }
    }
    for (i = 0; i < nbchild; i++) {
        if (list[i] != NULL)
            xmlFree(list[i]);
    }

    xmlFree(list);
    def->dflags |= IS_PROCESSED;
}